

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg)

{
  int *piVar1;
  undefined8 *puVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ImGuiWindow *pIVar6;
  ImGuiWindow *pIVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  bool bVar10;
  ImGuiContext *g;
  long lVar11;
  ImVec2 *pIVar12;
  uint uVar13;
  float *pfVar14;
  ImRect *pIVar15;
  ImGuiWindow *window;
  long lVar16;
  float fVar17;
  float fVar18;
  ImVec2 IVar19;
  float fVar20;
  ImVec2 IVar21;
  ImVec2 IVar22;
  ImVec2 IVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  ImVec2 local_38;
  float local_30;
  float fStack_2c;
  
  pIVar8 = GImGui;
  pIVar12 = &local_38;
  pIVar6 = GImGui->CurrentWindow;
  if (id == 0) goto LAB_00173b3a;
  piVar1 = &(pIVar6->DC).NavLayerActiveMaskNext;
  *piVar1 = *piVar1 | (pIVar6->DC).NavLayerCurrentMask;
  uVar3 = pIVar8->NavId;
  if ((((uVar3 != id) && (pIVar8->NavAnyRequest != true)) ||
      (pIVar7 = pIVar8->NavWindow, pIVar7->RootWindowForNav != pIVar6->RootWindowForNav)) ||
     ((pIVar6 != pIVar7 && (((uint)(pIVar7->Flags | pIVar6->Flags) >> 0x17 & 1) == 0))))
  goto LAB_00173b3a;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  uVar13 = (pIVar6->DC).ItemFlags;
  fVar24 = (pIVar6->Pos).x;
  fVar17 = (nav_bb_arg->Min).x - fVar24;
  fVar20 = (pIVar6->Pos).y;
  fVar18 = (nav_bb_arg->Min).y - fVar20;
  IVar19.x = (nav_bb_arg->Max).x - fVar24;
  IVar19.y = (nav_bb_arg->Max).y - fVar20;
  if ((pIVar8->NavInitRequest == true) && (pIVar8->NavLayer == (pIVar6->DC).NavLayerCurrent)) {
    if ((uVar13 & 0x10) == 0) {
      pIVar8->NavInitResultId = id;
      IVar21.y = fVar18;
      IVar21.x = fVar17;
      (pIVar8->NavInitResultRectRel).Min = IVar21;
      (pIVar8->NavInitResultRectRel).Max = IVar19;
      pIVar8->NavInitRequest = false;
      if (pIVar8->NavMoveRequest == false) {
        pIVar8->NavAnyRequest = false;
      }
      else {
        pIVar8->NavAnyRequest = true;
      }
    }
    else if (pIVar8->NavInitResultId == 0) {
      pIVar8->NavInitResultId = id;
      IVar22.y = fVar18;
      IVar22.x = fVar17;
      (pIVar8->NavInitResultRectRel).Min = IVar22;
      (pIVar8->NavInitResultRectRel).Max = IVar19;
    }
  }
  if ((uVar3 != id) && ((uVar13 & 8) == 0)) {
    lVar11 = 0x1b30;
    if (pIVar6 == pIVar7) {
      lVar11 = 0x1b00;
    }
    if (pIVar8->NavMoveRequest == true) {
      local_30 = (nav_bb_arg->Min).x;
      fStack_2c = (nav_bb_arg->Min).y;
      local_38 = nav_bb_arg->Max;
      iVar4 = pIVar8->NavLayer;
      if (iVar4 == (pIVar6->DC).NavLayerCurrent) {
        pIVar8->NavScoringCount = pIVar8->NavScoringCount + 1;
        if ((uint)pIVar8->NavMoveClipDir < 2) {
          IVar23.y = local_38.y;
          IVar23.x = IVar23.y;
          pIVar12 = (ImVec2 *)&local_38.y;
          pfVar14 = &fStack_2c;
          lVar16 = 0xc;
          pIVar15 = (ImRect *)&(pIVar6->ClipRect).Min.y;
          fVar24 = fStack_2c;
        }
        else {
          pfVar14 = &local_30;
          lVar16 = 8;
          pIVar15 = &pIVar6->ClipRect;
          IVar23 = local_38;
          fVar24 = local_30;
        }
        fVar20 = (pIVar15->Min).x;
        fVar25 = *(float *)((long)&(pIVar6->ClipRect).Min.x + lVar16);
        fVar28 = fVar25;
        if (fVar24 <= fVar25) {
          fVar28 = fVar24;
        }
        *pfVar14 = (float)(-(uint)(fVar24 < fVar20) & (uint)fVar20 |
                          ~-(uint)(fVar24 < fVar20) & (uint)fVar28);
        fVar24 = IVar23.x;
        if (fVar24 <= fVar25) {
          fVar25 = fVar24;
        }
        *(uint *)pIVar12 =
             -(uint)(fVar24 < fVar20) & (uint)fVar20 | ~-(uint)(fVar24 < fVar20) & (uint)fVar25;
        fVar24 = (pIVar8->NavScoringRectScreen).Min.x;
        fVar20 = (pIVar8->NavScoringRectScreen).Max.x;
        if (fVar24 <= local_38.x) {
          fVar25 = 0.0;
          if (fVar20 < local_30) {
            fVar25 = local_30 - fVar20;
          }
        }
        else {
          fVar25 = local_38.x - fVar24;
        }
        fVar28 = (pIVar8->NavScoringRectScreen).Min.y;
        fVar29 = (pIVar8->NavScoringRectScreen).Max.y;
        fVar30 = fVar29 - fVar28;
        fVar26 = (local_38.y - fStack_2c) * 0.8 + fStack_2c;
        fVar27 = fVar30 * 0.2 + fVar28;
        if (fVar27 <= fVar26) {
          fVar26 = (local_38.y - fStack_2c) * 0.2 + fStack_2c;
          fVar27 = fVar30 * 0.8 + fVar28;
          if (fVar27 < fVar26) {
            fVar26 = fVar26 - fVar27;
            goto LAB_00173de8;
          }
          fVar26 = 0.0;
          bVar9 = false;
        }
        else {
          fVar26 = fVar26 - fVar27;
LAB_00173de8:
          bVar9 = fVar26 != 0.0;
          if (((fVar25 != 0.0) || (NAN(fVar25))) && ((fVar26 != 0.0 || (NAN(fVar26))))) {
            fVar25 = fVar25 / 1000.0 + *(float *)(&DAT_001d9a90 + (ulong)(0.0 < fVar25) * 4);
            bVar9 = true;
          }
        }
        fVar20 = (local_30 + local_38.x) - (fVar24 + fVar20);
        fVar24 = (fStack_2c + local_38.y) - (fVar28 + fVar29);
        fVar28 = ABS(fVar26) + ABS(fVar25);
        fVar29 = ABS(fVar20) + ABS(fVar24);
        if (bVar9) {
LAB_00173eb0:
          fVar27 = fVar28;
          uVar13 = (uint)(0.0 < fVar25);
          fVar24 = fVar26;
          fVar20 = fVar25;
          if (ABS(fVar25) <= ABS(fVar26)) {
            uVar13 = 0.0 < fVar26 | 2;
          }
        }
        else {
          if ((fVar25 != 0.0) || (NAN(fVar25))) goto LAB_00173eb0;
          if ((((fVar20 != 0.0) || (NAN(fVar20))) || (fVar24 != 0.0)) || (NAN(fVar24))) {
            fVar27 = fVar29;
            uVar13 = 0.0 < fVar24 | 2;
            if (ABS(fVar24) < ABS(fVar20)) {
              uVar13 = (uint)(0.0 < fVar20);
            }
          }
          else {
            fVar27 = 0.0;
            uVar13 = (uint)(uVar3 <= (pIVar6->DC).LastItemId);
            fVar24 = 0.0;
            fVar20 = 0.0;
          }
        }
        uVar5 = pIVar8->NavMoveDir;
        fVar30 = *(float *)((long)(pIVar8->IO).KeyMap + lVar11 + -0x2c);
        if (uVar13 != uVar5) goto LAB_00173f74;
        if (fVar30 <= fVar28) {
          if ((fVar28 != fVar30) || (NAN(fVar28) || NAN(fVar30))) {
LAB_00173f74:
            bVar9 = false;
          }
          else {
            fVar28 = *(float *)((long)(pIVar8->IO).KeyMap + lVar11 + -0x28);
            if (fVar28 <= fVar29) {
              if ((fVar29 == fVar28) && (!NAN(fVar29) && !NAN(fVar28))) {
                if ((uVar13 & 2) == 0) {
                  fVar26 = fVar25;
                }
                if (fVar26 < 0.0) goto LAB_00173f6f;
              }
              goto LAB_00173f74;
            }
            *(float *)((long)(pIVar8->IO).KeyMap + lVar11 + -0x28) = fVar29;
LAB_00173f6f:
            bVar9 = true;
          }
          if (((((fVar30 != 3.4028235e+38) || (NAN(fVar30))) || (iVar4 != 1)) ||
              ((*(float *)((long)(pIVar8->IO).KeyMap + lVar11 + -0x24) <= fVar27 ||
               ((pIVar7->Flags & 0x10000000) != 0)))) ||
             ((((0.0 <= fVar20 || uVar5 != 0 && (fVar20 <= 0.0 || uVar5 != 1)) &&
               ((uVar5 != 2 || (0.0 <= fVar24)))) && ((uVar5 != 3 || (fVar24 <= 0.0)))))) {
            if (!bVar9) goto LAB_0017401d;
          }
          else {
            *(float *)((long)(pIVar8->IO).KeyMap + lVar11 + -0x24) = fVar27;
          }
        }
        else {
          *(ulong *)((long)(pIVar8->IO).KeyMap + lVar11 + -0x2c) = CONCAT44(fVar29,fVar28);
        }
        *(ImGuiID *)((long)(pIVar8->IO).KeyMap + lVar11 + -0x3c) = id;
        lVar16 = (long)(pIVar6->IDStack).Size;
        if (lVar16 < 1) {
          __assert_fail("Size > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                        ,0x4ca,"value_type &ImVector<unsigned int>::back() [T = unsigned int]");
        }
        *(uint *)((long)(pIVar8->IO).KeyMap + lVar11 + -0x38) = (pIVar6->IDStack).Data[lVar16 + -1];
        *(ImGuiWindow **)((long)(pIVar8->IO).KeyMap + lVar11 + -0x34) = pIVar6;
        puVar2 = (undefined8 *)((long)(pIVar8->IO).KeyMap + lVar11 + -0x20);
        *puVar2 = CONCAT44(fVar18,fVar17);
        *(ImVec2 *)(puVar2 + 1) = IVar19;
      }
    }
  }
LAB_0017401d:
  if (uVar3 == id) {
    pIVar8->NavWindow = pIVar6;
    iVar4 = (pIVar6->DC).NavLayerCurrent;
    pIVar8->NavLayer = iVar4;
    pIVar8->NavIdIsAlive = true;
    pIVar8->NavIdTabCounter = pIVar6->FocusIdxTabCounter;
    pIVar15 = pIVar6->NavRectRel + iVar4;
    (pIVar15->Min).x = fVar17;
    (pIVar15->Min).y = fVar18;
    (pIVar15->Max).x = IVar19.x;
    (pIVar15->Max).y = IVar19.y;
  }
LAB_00173b3a:
  (pIVar6->DC).LastItemId = id;
  IVar19 = bb->Max;
  (pIVar6->DC).LastItemRect.Min = bb->Min;
  (pIVar6->DC).LastItemRect.Max = IVar19;
  (pIVar6->DC).LastItemStatusFlags = 0;
  bVar9 = IsClippedEx(bb,id,false);
  if ((!bVar9) && (bVar10 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar10)) {
    (pIVar6->DC).LastItemStatusFlags = 1;
  }
  return !bVar9;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests unfortunately, but it is still limited to one window.
        //      it may not scale very well for windows with ten of thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick)
        window->DC.NavLayerActiveMaskNext |= window->DC.NavLayerCurrentMask;
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);
    }

    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = 0;

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}